

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::ReflectionTester::ExpectOneofSetViaReflection(Message *message)

{
  bool bVar1;
  Descriptor *this;
  Reflection *this_00;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  Message *this_01;
  Reflection *this_02;
  Descriptor *this_03;
  string *psVar4;
  char *in_R9;
  AssertHelper local_340;
  Message local_338;
  string_view local_330;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_5;
  Message local_308;
  string_view local_300;
  string local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_4;
  Message local_2b8;
  string_view local_2b0;
  int32_t local_2a0;
  int local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_3;
  Message local_280;
  string_view local_278;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_2;
  Message local_250;
  string_view local_248;
  string local_238;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_1;
  Message local_200;
  string_view local_1f8;
  int64_t local_1e8;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  Message *sub_message;
  AssertHelper local_190;
  Message local_188;
  string_view local_180;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_138;
  Message local_130;
  string_view local_128;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_e0;
  Message local_d8;
  string_view local_d0;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88;
  Message local_80 [3];
  string_view local_68;
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  string scratch;
  Reflection *reflection;
  Descriptor *descriptor;
  Message *message_local;
  
  this = Message::GetDescriptor(message);
  this_00 = Message::GetReflection(message);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,"foo_lazy_message");
  pFVar2 = Descriptor::FindFieldByName(this,local_68);
  local_51 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_50,
               (AssertionResult *)
               "reflection->HasField( message, descriptor->FindFieldByName(\"foo_lazy_message\"))",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x16b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"bar_cord");
  pFVar2 = Descriptor::FindFieldByName(this,local_d0);
  local_b9 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_b8,
               (AssertionResult *)
               "reflection->HasField(message, descriptor->FindFieldByName(\"bar_cord\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x16d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"baz_int");
  pFVar2 = Descriptor::FindFieldByName(this,local_128);
  local_111 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_110,
               (AssertionResult *)
               "reflection->HasField(message, descriptor->FindFieldByName(\"baz_int\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x16f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_180,"baz_string");
  pFVar2 = Descriptor::FindFieldByName(this,local_180);
  local_169 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sub_message,(internal *)local_168,
               (AssertionResult *)
               "reflection->HasField(message, descriptor->FindFieldByName(\"baz_string\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x171,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&sub_message);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "foo_lazy_message");
  pFVar2 = Descriptor::FindFieldByName(this,stack0xfffffffffffffe38);
  this_01 = Reflection::GetMessage(this_00,message,pFVar2,(MessageFactory *)0x0);
  local_1dc = 100;
  this_02 = Message::GetReflection(this_01);
  this_03 = Message::GetDescriptor(this_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f8,"moo_int");
  pFVar2 = Descriptor::FindFieldByName(this_03,local_1f8);
  local_1e8 = Reflection::GetInt64(this_02,this_01,pFVar2);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_1d8,"100",
             "sub_message->GetReflection()->GetInt64( *sub_message, sub_message->GetDescriptor()->FindFieldByName(\"moo_int\"))"
             ,&local_1dc,&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x177,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"bar_cord");
  pFVar2 = Descriptor::FindFieldByName(this,local_248);
  Reflection::GetString_abi_cxx11_(&local_238,this_00,message,pFVar2);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_218,"\"101\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"bar_cord\"))",
             (char (*) [4])0x1dc594d,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x17a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_278,"bar_cord");
  pFVar2 = Descriptor::FindFieldByName(this,local_278);
  psVar4 = Reflection::GetStringReference(this_00,message,pFVar2,(string *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_268,"\"101\"",
             "reflection->GetStringReference( message, descriptor->FindFieldByName(\"bar_cord\"), &scratch)"
             ,(char (*) [4])0x1dc594d,psVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x17d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  local_29c = 0x66;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b0,"baz_int");
  pFVar2 = Descriptor::FindFieldByName(this,local_2b0);
  local_2a0 = Reflection::GetInt32(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_298,"102",
             "reflection->GetInt32(message, descriptor->FindFieldByName(\"baz_int\"))",&local_29c,
             &local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x180,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_300,"baz_string");
  pFVar2 = Descriptor::FindFieldByName(this,local_300);
  Reflection::GetString_abi_cxx11_(&local_2f0,this_00,message,pFVar2);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2d0,"\"103\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"baz_string\"))",
             (char (*) [4])"103",&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x183,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_330,"baz_string");
  pFVar2 = Descriptor::FindFieldByName(this,local_330);
  psVar4 = Reflection::GetStringReference(this_00,message,pFVar2,(string *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_320,"\"103\"",
             "reflection->GetStringReference( message, descriptor->FindFieldByName(\"baz_string\"), &scratch)"
             ,(char (*) [4])"103",psVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x186,pcVar3);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::ExpectOneofSetViaReflection(
    const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();
  std::string scratch;
  EXPECT_TRUE(reflection->HasField(
      message, descriptor->FindFieldByName("foo_lazy_message")));
  EXPECT_TRUE(
      reflection->HasField(message, descriptor->FindFieldByName("bar_cord")));
  EXPECT_TRUE(
      reflection->HasField(message, descriptor->FindFieldByName("baz_int")));
  EXPECT_TRUE(
      reflection->HasField(message, descriptor->FindFieldByName("baz_string")));

  const Message* sub_message = &reflection->GetMessage(
      message, descriptor->FindFieldByName("foo_lazy_message"));
  EXPECT_EQ(100, sub_message->GetReflection()->GetInt64(
                     *sub_message,
                     sub_message->GetDescriptor()->FindFieldByName("moo_int")));

  EXPECT_EQ("101", reflection->GetString(
                       message, descriptor->FindFieldByName("bar_cord")));
  EXPECT_EQ("101",
            reflection->GetStringReference(
                message, descriptor->FindFieldByName("bar_cord"), &scratch));

  EXPECT_EQ(102, reflection->GetInt32(message,
                                      descriptor->FindFieldByName("baz_int")));

  EXPECT_EQ("103", reflection->GetString(
                       message, descriptor->FindFieldByName("baz_string")));
  EXPECT_EQ("103",
            reflection->GetStringReference(
                message, descriptor->FindFieldByName("baz_string"), &scratch));
}